

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

bool_t botpTOTPStepV(char *otp,tm_time_t t,void *state)

{
  int iVar1;
  
  botpTOTPStepR((char *)((long)state + 0x30),t,state);
  iVar1 = strCmp((char *)((long)state + 0x30),otp);
  return (bool_t)(iVar1 == 0);
}

Assistant:

bool_t botpTOTPStepV(const char* otp, tm_time_t t, void* state)
{
	botp_totp_st* st = (botp_totp_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(t != TIME_ERR);
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpTOTP_keep()));
	// вычислить и проверить пароль
	botpTOTPStepR(st->otp, t, state);
	return strEq(st->otp, otp);
}